

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrapBufferedRegionProfile.cpp
# Opt level: O2

cali_BufferedRegionProfile * cali_BufferedRegionProfile_new(cali_BufferedRegionProfile *SHC_rv)

{
  BufferedRegionProfile *this;
  
  this = (BufferedRegionProfile *)operator_new(0x38);
  cali::BufferedRegionProfile::BufferedRegionProfile(this);
  SHC_rv->addr = this;
  SHC_rv->idtor = 5;
  return SHC_rv;
}

Assistant:

cali_BufferedRegionProfile* cali_BufferedRegionProfile_new(cali_BufferedRegionProfile* SHC_rv)
{
    // splicer begin class.BufferedRegionProfile.method.new
    cali::BufferedRegionProfile* SHCXX_rv = new cali::BufferedRegionProfile();
    SHC_rv->addr                          = static_cast<void*>(SHCXX_rv);
    SHC_rv->idtor                         = 5;
    return SHC_rv;
    // splicer end class.BufferedRegionProfile.method.new
}